

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockpacking.h
# Opt level: O2

void __thiscall
FastPForLib::FastBinaryPacking<16U>::encodeArray
          (FastBinaryPacking<16U> *this,uint32_t *in,size_t length,uint32_t *out,size_t *nvalue)

{
  uint32_t *puVar1;
  uint32_t uVar2;
  uint32_t *out_00;
  uint32_t i;
  uint32_t *puVar3;
  long lVar4;
  uint32_t *puVar5;
  uint32_t Bs [4];
  uint32_t *local_40;
  uint32_t *local_38;
  
  checkifdivisibleby(length,0x40);
  out_00 = out + 1;
  *out = (uint32_t)length;
  puVar5 = in;
  while (puVar1 = puVar5 + 0x40, puVar1 <= in + length) {
    puVar3 = puVar5;
    for (lVar4 = 0; lVar4 != 4; lVar4 = lVar4 + 1) {
      local_40 = puVar3 + 0x10;
      local_38 = puVar3;
      uVar2 = maxbits<unsigned_int_const*>(&local_38,&local_40);
      Bs[lVar4] = uVar2;
      puVar3 = puVar3 + 0x10;
    }
    *out_00 = Bs[2] << 8 | Bs[1] << 0x10 | Bs[0] << 0x18 | Bs[3];
    out_00 = out_00 + 1;
    puVar3 = puVar5;
    for (lVar4 = 0; puVar5 = puVar1, lVar4 != 4; lVar4 = lVar4 + 1) {
      out_00 = fastpackwithoutmask_16(puVar3,out_00,Bs[lVar4]);
      puVar3 = puVar3 + 0x10;
    }
  }
  *nvalue = (long)out_00 - (long)out >> 2;
  return;
}

Assistant:

void encodeArray(const uint32_t *in, const size_t length, uint32_t *out,
                   size_t &nvalue) override {
    checkifdivisibleby(length, BlockSize);
    const uint32_t *const initout(out);
    *out++ = static_cast<uint32_t>(length);
    uint32_t Bs[HowManyMiniBlocks];
    for (const uint32_t *const final = in + length; in + BlockSize <= final;
         in += BlockSize) {
      for (uint32_t i = 0; i < HowManyMiniBlocks; ++i)
        Bs[i] = maxbits(in + i * MiniBlockSize, in + (i + 1) * MiniBlockSize);
      *out++ = (Bs[0] << 24) | (Bs[1] << 16) | (Bs[2] << 8) | Bs[3];
      for (uint32_t i = 0; i < HowManyMiniBlocks; ++i) {
        if (MiniBlockSize == 8)
          out = fastpackwithoutmask_8(in + i * MiniBlockSize, out, Bs[i]);
        else if (MiniBlockSize == 16)
          out = fastpackwithoutmask_16(in + i * MiniBlockSize, out, Bs[i]);
        else if (MiniBlockSize == 24)
          out = fastpackwithoutmask_24(in + i * MiniBlockSize, out, Bs[i]);
        else if (MiniBlockSize == 32) {
          fastpackwithoutmask(in + i * MiniBlockSize, out, Bs[i]);
          out += Bs[i];

        } else
          throw std::logic_error("unsupported MiniBlockSize");
      }
    }
    nvalue = out - initout;
  }